

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O0

mpt_metatype * mpt_rawdata_create(long max)

{
  int *piVar1;
  mpt_RawData *rd;
  long max_local;
  
  if (max < 0x7fffffffffffffff) {
    rd = (mpt_RawData *)max;
    if (max < 0) {
      rd = (mpt_RawData *)0x0;
    }
    max_local = (long)malloc(0x30);
    if ((void *)max_local == (void *)0x0) {
      max_local = 0;
    }
    else {
      memcpy((void *)max_local,&mpt_rawdata_create::def,0x30);
      *(mpt_RawData **)(max_local + 0x28) = rd;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    max_local = 0;
  }
  return (mpt_metatype *)max_local;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_rawdata_create(long max)
{
	static const MPT_INTERFACE_VPTR(metatype) meta = {
		{ rd_conv },
		rd_unref,
		rd_ref,
		rd_clone
	};
	static const MPT_INTERFACE_VPTR(rawdata) raw = {
		rd_modify,
		rd_advance,
		rd_values,
		rd_dimensions,
		rd_stages
	};
	static const MPT_STRUCT(RawData) def = {
		{ &meta },
		{ &raw },
		{ 1 },
		MPT_ARRAY_INIT,
		0, 0
	};
	MPT_STRUCT(RawData) *rd;
	
	if (max >= LONG_MAX) {
		errno = EINVAL;
		return 0;
	}
	if (max < 0) {
		max = 0;
	}
	if (!(rd = malloc(sizeof(*rd)))) {
		return 0;
	}
	*rd = def;
	rd->max = max;
	
	return &rd->_mt;
}